

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O2

void __thiscall clask::server_t::static_dir(server_t *this,string *path,string *dir,bool listing)

{
  undefined1 auStack_c8 [64];
  bool local_88;
  func_t local_80;
  
  std::__cxx11::string::string((string *)auStack_c8,(string *)path);
  std::__cxx11::string::string((string *)(auStack_c8 + 0x20),(string *)dir);
  local_88 = listing;
  std::function<void(clask::response_writer&,clask::request&)>::
  function<clask::server_t::static_dir(std::__cxx11::string_const&,std::__cxx11::string_const&,bool)::_lambda(clask::response_writer&,clask::request&)_1_,void>
            ((function<void(clask::response_writer&,clask::request&)> *)&local_80,
             (anon_class_72_3_b8803698 *)auStack_c8);
  local_80.f_response.super__Function_base._M_manager = (_Manager_type)0x0;
  local_80.f_response._M_invoker = (_Invoker_type)0x0;
  local_80.f_response.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_80.f_response.super__Function_base._M_functor._8_8_ = 0;
  local_80.f_string.super__Function_base._M_manager = (_Manager_type)0x0;
  local_80.f_string._M_invoker = (_Invoker_type)0x0;
  local_80.f_string.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_80.f_string.super__Function_base._M_functor._8_8_ = 0;
  parse_tree(this,&this->treeGET,path,&local_80);
  _func_t::~_func_t(&local_80);
  static_dir(std::__cxx11::string_const&,std::__cxx11::string_const&,bool)::
  {lambda(clask::response_writer&,clask::request&)#1}::~request
            ((_lambda_clask__response_writer__clask__request___1_ *)auStack_c8);
  return;
}

Assistant:

inline void server_t::static_dir(const std::string& path, const std::string& dir, bool listing) {
  parse_tree(treeGET, path, func_t {
    .f_writer = [path, dir, listing](response_writer& resp, request& req) {
      std::vector<std::string> paths;
      std::string p = req.uri;
      while (true) {
        auto pos = p.find('/', 1);
        if (pos == std::string::npos) {
          auto sub = p.substr(1);
          if (sub == "..") paths.pop_back();
          else paths.emplace_back(sub);
          break;
        } else {
          auto sub = p.substr(1, pos - 1);
          if (sub == "..") paths.pop_back();
          else paths.emplace_back(sub);
        }
        p = p.substr(pos);
      }
      std::ostringstream os;
      for (auto it = paths.begin(); it != paths.end(); ++it) {
        if (it != paths.end()) os << "/";
        os << *it;
      }
      auto req_path = os.str();
      auto res = std::mismatch(req_path.begin(), req_path.end(), path.begin());
      if (res.first == path.end()) {
        resp.code = 404;
        resp.set_header("content-type", "text/plain");
        resp.write("Not Found");
        return;
      }
      req_path = url_decode(req_path.substr(path.size()));
      req_path = dir + "/" + req_path;
      if (req_path[req_path.size() - 1] == '/') {
        if (listing) {
          serve_dir(resp, req, req_path);
          return;
        }
        req_path += "index.html";
      }

      serve_file(resp, req, req_path);
    }
  });
}